

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::HlslParseContext::shouldFlatten
          (HlslParseContext *this,TType *type,TStorageQualifier qualifier,bool topLevel)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  long lVar4;
  
  if (qualifier - EvqVaryingIn < 2) {
    iVar3 = (*type->_vptr_TType[0x25])(type);
    lVar4 = 0xe8;
    bVar1 = true;
    if ((char)iVar3 == '\0') {
LAB_0037ee86:
      uVar2 = (**(code **)((long)type->_vptr_TType + lVar4))(type);
      return (bool)uVar2;
    }
  }
  else {
    if (qualifier == EvqUniform) {
      iVar3 = (*type->_vptr_TType[0x1d])(type);
      if (((char)iVar3 != '\0') &&
         ((((this->super_TParseContextBase).super_TParseVersions.intermediate)->flattenUniformArrays
          & topLevel) != 0)) {
        return true;
      }
      iVar3 = (*type->_vptr_TType[0x25])(type);
      lVar4 = 0x1b0;
      if ((char)iVar3 != '\0') goto LAB_0037ee86;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HlslParseContext::shouldFlatten(const TType& type, TStorageQualifier qualifier, bool topLevel) const
{
    switch (qualifier) {
    case EvqVaryingIn:
    case EvqVaryingOut:
        return type.isStruct() || type.isArray();
    case EvqUniform:
        return (type.isArray() && intermediate.getFlattenUniformArrays() && topLevel) ||
               (type.isStruct() && type.containsOpaque());
    default:
        return false;
    };
}